

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O1

void __thiscall
fill<16U,_2U,_buffer_layout_dfs>::operator()
          (fill<16U,_2U,_buffer_layout_dfs> *this,array<Stream,_16UL> *streams,uchar **buffer,
          array<unsigned_long,_16UL> *buffer_count)

{
  unsigned_long uVar1;
  uchar *__s1;
  unsigned_long uVar2;
  uchar *__s2;
  array<unsigned_long,_16UL> *buffer_count_00;
  int iVar3;
  long lVar4;
  unsigned_long *puVar5;
  size_t __n;
  unsigned_long *puVar6;
  long lVar7;
  uchar **from0;
  size_t local_70;
  fill<16U,_4U,_buffer_layout_dfs> local_64;
  fill<16U,_5U,_buffer_layout_dfs> local_63;
  fill<16U,_5U,_buffer_layout_dfs> local_62;
  fill<16U,_4U,_buffer_layout_dfs> local_61;
  array<Stream,_16UL> *local_60;
  long local_58;
  uchar **local_50;
  unsigned_long *local_48;
  array<unsigned_long,_16UL> *local_40;
  unsigned_long *local_38;
  
  puVar6 = buffer_count->_M_elems + 4;
  local_38 = buffer_count->_M_elems + 5;
  local_50 = buffer + 8;
  local_58 = 0;
  local_70 = 0;
  local_60 = streams;
  local_48 = puVar6;
  local_40 = buffer_count;
  while ((buffer_count_00 = local_40, *puVar6 != 0 ||
         (fill<16U,_4U,_buffer_layout_dfs>::operator()(&local_61,local_60,buffer,local_40),
         buffer_count_00->_M_elems[4] != 0))) {
    puVar5 = local_38;
    if ((*local_38 == 0) &&
       (fill<16U,_5U,_buffer_layout_dfs>::operator()(&local_62,local_60,buffer,buffer_count_00),
       buffer_count_00->_M_elems[5] == 0)) {
      __n = -local_58;
      lVar4 = -local_70;
      goto LAB_0015d0f9;
    }
    uVar1 = *puVar6;
    __s1 = buffer[0x48 - uVar1];
    if (__s1 == (uchar *)0x0) {
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
    }
    uVar2 = *puVar5;
    __s2 = buffer[0x98 - uVar2];
    if (__s2 == (uchar *)0x0) {
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar3 = strcmp((char *)__s1,(char *)__s2);
    puVar6 = local_48;
    if (iVar3 < 1) {
      puVar5 = local_48;
      __s2 = __s1;
      uVar2 = uVar1;
    }
    buffer[local_70] = __s2;
    *puVar5 = uVar2 - 1;
    check_input(buffer,local_70);
    local_70 = local_70 + 1;
    local_58 = local_58 + -8;
    if (local_70 == 8) {
      local_40->_M_elems[2] = 8;
      return;
    }
  }
  lVar7 = -0x40 - local_58;
  lVar4 = 8 - local_70;
  do {
    if ((buffer_count_00->_M_elems[5] == 0) &&
       (fill<16U,_5U,_buffer_layout_dfs>::operator()(&local_63,local_60,buffer,buffer_count_00),
       buffer_count_00->_M_elems[5] == 0)) {
      from0 = (uchar **)((long)buffer - lVar7);
      memmove(buffer + lVar4,buffer,lVar7 + 0x40);
      buffer_count_00->_M_elems[2] = local_70;
      goto LAB_0015d150;
    }
    uVar1 = buffer_count_00->_M_elems[5];
    buffer[local_70] = buffer[0x98 - uVar1];
    buffer_count_00->_M_elems[5] = uVar1 - 1;
    lVar4 = lVar4 + -1;
    local_70 = local_70 + 1;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0);
  goto LAB_0015d140;
  while( true ) {
    uVar1 = *puVar6;
    *(uchar **)((long)buffer + __n) = buffer[0x48 - uVar1];
    *puVar6 = uVar1 - 1;
    lVar4 = lVar4 + -1;
    __n = __n + 8;
    if (__n == 0x40) break;
LAB_0015d0f9:
    if ((*puVar6 == 0) &&
       (fill<16U,_4U,_buffer_layout_dfs>::operator()(&local_64,local_60,buffer,buffer_count_00),
       buffer_count_00->_M_elems[4] == 0)) {
      from0 = (uchar **)((long)local_50 - __n);
      local_70 = -lVar4;
      memmove(local_50 + lVar4,buffer,__n);
      buffer_count_00->_M_elems[2] = local_70;
      goto LAB_0015d150;
    }
  }
LAB_0015d140:
  buffer_count_00->_M_elems[2] = 8;
  local_70 = 8;
  from0 = buffer;
LAB_0015d150:
  check_input(from0,local_70);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}